

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O1

Attribute * Imf_2_5::TypedAttribute<Imf_2_5::ChannelList>::makeNewAttribute(void)

{
  Attribute *this;
  
  this = (Attribute *)operator_new(0x38);
  this->_vptr_Attribute = (_func_int **)0x0;
  this[1]._vptr_Attribute = (_func_int **)0x0;
  this[2]._vptr_Attribute = (_func_int **)0x0;
  this[3]._vptr_Attribute = (_func_int **)0x0;
  this[4]._vptr_Attribute = (_func_int **)0x0;
  this[5]._vptr_Attribute = (_func_int **)0x0;
  this[6]._vptr_Attribute = (_func_int **)0x0;
  Attribute::Attribute(this);
  this->_vptr_Attribute = (_func_int **)&PTR__TypedAttribute_0315eef8;
  *(undefined4 *)&this[2]._vptr_Attribute = 0;
  this[3]._vptr_Attribute = (_func_int **)0x0;
  this[4]._vptr_Attribute = (_func_int **)(this + 2);
  this[5]._vptr_Attribute = (_func_int **)(this + 2);
  this[6]._vptr_Attribute = (_func_int **)0x0;
  return this;
}

Assistant:

Attribute *
TypedAttribute<T>::makeNewAttribute ()
{
    return new TypedAttribute<T>();
}